

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

float Am_Delayed_Timing_proc(Am_Object *interp,Am_Time *t)

{
  bool bVar1;
  Am_Value *in_value;
  float fVar2;
  Am_Time delay;
  Am_Time local_30;
  Am_Object local_28;
  Am_Time local_20;
  
  in_value = Am_Object::Get(interp,0x104,0);
  Am_Time::Am_Time(&local_20,in_value);
  bVar1 = Am_Time::operator<(t,&local_20);
  fVar2 = 0.0;
  if (!bVar1) {
    Am_Object::Am_Object(&local_28,interp);
    Am_Time::operator-(&local_30,t);
    fVar2 = Am_Linear_Timing_proc(&local_28,&local_30);
    Am_Time::~Am_Time(&local_30);
    Am_Object::~Am_Object(&local_28);
  }
  Am_Time::~Am_Time(&local_20);
  return fVar2;
}

Assistant:

Am_Define_Method(Am_Timing_Function, float, Am_Delayed_Timing,
                 (Am_Object interp, Am_Time t))
{
  Am_Time delay = interp.Get(Am_INITIAL_DELAY);

  if (t < delay)
    return 0.0;
  else
    return Am_Linear_Timing_proc(interp, t - delay);
}